

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  Location *parent;
  bool bVar1;
  int path2;
  string *output;
  OneofOptions *options;
  FieldDescriptorProto *this_00;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages;
  FieldDescriptorProto *field;
  LocationRecorder field_location;
  string local_c8;
  undefined1 local_a8 [8];
  LocationRecorder option_location;
  string local_88;
  uint local_68;
  undefined1 local_58 [8];
  LocationRecorder name_location;
  LocationRecorder *containing_type_location_local;
  LocationRecorder *oneof_location_local;
  int oneof_index_local;
  DescriptorProto *containing_type_local;
  OneofDescriptorProto *oneof_decl_local;
  Parser *this_local;
  
  name_location.location_ = (Location *)containing_type_location;
  bVar1 = Consume(this,"oneof");
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_58,oneof_location,1);
    output = OneofDescriptorProto::mutable_name_abi_cxx11_(oneof_decl);
    bVar1 = ConsumeIdentifier(this,output,"Expected oneof name.");
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    local_68 = (uint)!bVar1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
    if (local_68 == 0) {
      bVar1 = ConsumeEndOfDeclaration(this,"{",oneof_location);
      if (bVar1) {
        do {
          bVar1 = AtEnd(this);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_88,
                       "Reached end of input in oneof definition (missing \'}\').",
                       (allocator *)((long)&option_location.location_ + 7));
            AddError(this,&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)&option_location.location_ + 7));
            this_local._7_1_ = 0;
            goto LAB_00635825;
          }
          bVar1 = LookingAt(this,"option");
          if (bVar1) {
            LocationRecorder::LocationRecorder((LocationRecorder *)local_a8,oneof_location,2);
            options = OneofDescriptorProto::mutable_options(oneof_decl);
            bVar1 = ParseOption(this,&options->super_Message,(LocationRecorder *)local_a8,
                                containing_file,OPTION_STATEMENT);
            if (bVar1) {
              local_68 = 3;
            }
            else {
              this_local._7_1_ = 0;
              local_68 = 1;
            }
            LocationRecorder::~LocationRecorder((LocationRecorder *)local_a8);
            if (local_68 == 1) goto LAB_00635825;
          }
          else {
            bVar1 = LookingAt(this,"required");
            if (((bVar1) || (bVar1 = LookingAt(this,"optional"), bVar1)) ||
               (bVar1 = LookingAt(this,"repeated"), bVar1)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_c8,
                         "Fields in oneofs must not have labels (required / optional / repeated).",
                         (allocator *)((long)&field_location.location_ + 7));
              AddError(this,&local_c8);
              std::__cxx11::string::~string((string *)&local_c8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)&field_location.location_ + 7));
              io::Tokenizer::Next(this->input_);
            }
            parent = name_location.location_;
            path2 = DescriptorProto::field_size(containing_type);
            LocationRecorder::LocationRecorder
                      ((LocationRecorder *)&field,(LocationRecorder *)parent,2,path2);
            this_00 = DescriptorProto::add_field(containing_type);
            FieldDescriptorProto::set_label(this_00,FieldDescriptorProto_Label_LABEL_OPTIONAL);
            FieldDescriptorProto::set_oneof_index(this_00,oneof_index);
            messages = DescriptorProto::mutable_nested_type(containing_type);
            bVar1 = ParseMessageFieldNoLabel
                              (this,this_00,messages,(LocationRecorder *)name_location.location_,3,
                               (LocationRecorder *)&field,containing_file);
            if (!bVar1) {
              SkipStatement(this);
            }
            LocationRecorder::~LocationRecorder((LocationRecorder *)&field);
          }
          bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00635825:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type, int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      AddError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") || LookingAt("optional") ||
        LookingAt("repeated")) {
      AddError(
          "Fields in oneofs must not have labels (required / optional "
          "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field, containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}